

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O1

hrgls_MessageLevel __thiscall hrgls::Message::Level(Message *this)

{
  hrgls_Message phVar1;
  hrgls_MessageLevel hVar2;
  hrgls_Status hVar3;
  
  phVar1 = this->m_private->Message;
  if (phVar1 == (hrgls_Message)0x0) {
    hVar2 = 0;
    hVar3 = 0x3ee;
  }
  else {
    hVar2 = phVar1->level;
    hVar3 = 0;
  }
  this->m_private->status = hVar3;
  return hVar2;
}

Assistant:

hrgls_MessageLevel Message::Level() const
  {
	  hrgls_MessageLevel ret = {};
	  if (!m_private->Message) {
		  m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
		  return ret;
	  }
	  m_private->status = hrgls_MessageGetLevel(m_private->Message, &ret);
	  return ret;
  }